

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Performance::lineParamsString_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,LineParameters *params)

{
  long lVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  ulong *puVar5;
  size_type *psVar6;
  ulong uVar7;
  long *local_238;
  undefined8 local_230;
  long local_228;
  undefined8 uStack_220;
  ulong *local_218;
  long local_210;
  ulong local_208;
  long lStack_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  long *local_1d8;
  long local_1d0;
  long local_1c8;
  long lStack_1c0;
  long *local_1b8 [2];
  long local_1a8 [2];
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::_M_insert<double>((double)*(float *)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_1b8,0,(char *)0x0,0x1c55fe0);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1c8 = *plVar4;
    lStack_1c0 = plVar2[3];
    local_1d8 = &local_1c8;
  }
  else {
    local_1c8 = *plVar4;
    local_1d8 = (long *)*plVar2;
  }
  local_1d0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_208 = *puVar5;
    lStack_200 = plVar2[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *puVar5;
    local_218 = (ulong *)*plVar2;
  }
  local_210 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::ostream::_M_insert<double>((double)*(float *)(this + 4));
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  uVar7 = 0xf;
  if (local_218 != &local_208) {
    uVar7 = local_208;
  }
  if (uVar7 < (ulong)(local_1f0 + local_210)) {
    uVar7 = 0xf;
    if (local_1f8 != local_1e8) {
      uVar7 = local_1e8[0];
    }
    if ((ulong)(local_1f0 + local_210) <= uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_218);
      goto LAB_0139694b;
    }
  }
  puVar3 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1f8);
LAB_0139694b:
  local_238 = &local_228;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_228 = *plVar2;
    uStack_220 = puVar3[3];
  }
  else {
    local_228 = *plVar2;
    local_238 = (long *)*puVar3;
  }
  local_230 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_238);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar6 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar6) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar6;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_1f8 != local_1e8) {
    operator_delete(local_1f8,local_1e8[0] + 1);
  }
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,local_1c8 + 1);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static string lineParamsString (const LineParameters& params)
{
	return "y = " + de::toString(params.offset) + " + " + de::toString(params.coefficient) + "*x";
}